

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O1

void mod2dense_copy(mod2dense *m,mod2dense *r)

{
  uint uVar1;
  mod2word *pmVar2;
  mod2word *pmVar3;
  mod2word **ppmVar4;
  uint uVar5;
  ulong uVar6;
  ulong in_RCX;
  ulong uVar7;
  uint extraout_EDX;
  int extraout_EDX_00;
  long lVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  int iVar9;
  FILE *m_00;
  uint uVar10;
  FILE *__stream;
  int iVar11;
  
  if ((m->n_rows <= r->n_rows) && (m->n_cols <= r->n_cols)) {
    if (m->n_cols < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar7 = 0;
        if (0 < m->n_words) {
          pmVar2 = m->col[uVar6];
          pmVar3 = r->col[uVar6];
          uVar7 = 0;
          do {
            pmVar3[uVar7] = pmVar2[uVar7];
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)m->n_words);
        }
        if ((int)uVar7 < r->n_words) {
          pmVar2 = r->col[uVar6];
          uVar7 = uVar7 & 0xffffffff;
          do {
            pmVar2[uVar7] = 0;
            uVar7 = uVar7 + 1;
          } while ((int)uVar7 < r->n_words);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)m->n_cols);
    }
    if ((int)uVar6 < r->n_cols) {
      uVar6 = uVar6 & 0xffffffff;
      do {
        if (0 < r->n_words) {
          pmVar2 = r->col[uVar6];
          lVar8 = 0;
          do {
            pmVar2[lVar8] = 0;
            lVar8 = lVar8 + 1;
          } while (lVar8 < r->n_words);
        }
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < r->n_cols);
    }
    return;
  }
  mod2dense_copy_cold_1();
  iVar9 = (int)in_RCX;
  m_00 = (FILE *)r;
  __stream = (FILE *)m;
  if (*(int *)&((FILE *)m)->field_0x4 <= *(int *)&((FILE *)r)->field_0x4) {
    __stream = (FILE *)r;
    mod2dense_clear(r);
    if (0 < ((FILE *)r)->_flags) {
      uVar6 = 0;
      do {
        iVar9 = (int)in_RCX;
        iVar11 = *(int *)(extraout_RDX + uVar6 * 4);
        if ((iVar11 < 0) || (((FILE *)m)->_flags <= iVar11)) {
          mod2dense_copyrows_cold_1();
          goto LAB_001231a6;
        }
        if (0 < *(int *)&((FILE *)m)->field_0x4) {
          iVar9 = 0;
          do {
            uVar5 = mod2dense_get(m,*(int *)(extraout_RDX + uVar6 * 4),iVar9);
            m_00 = (FILE *)(uVar6 & 0xffffffff);
            in_RCX = (ulong)uVar5;
            __stream = (FILE *)r;
            mod2dense_set(r,(int)uVar6,iVar9,uVar5);
            iVar9 = iVar9 + 1;
          } while (iVar9 < *(int *)&((FILE *)m)->field_0x4);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)((FILE *)r)->_flags);
    }
    return;
  }
LAB_001231a6:
  mod2dense_copyrows_cold_2();
  uVar5 = (uint)m_00;
  if ((((-1 < (int)uVar5) && (-1 < (int)extraout_EDX)) && ((int)uVar5 < __stream->_flags)) &&
     ((int)extraout_EDX < *(int *)&__stream->field_0x4)) {
    uVar6 = (ulong)m_00 >> 5 & 0x7ffffff;
    uVar1 = (*(mod2word **)((long)__stream->_IO_read_end + (ulong)extraout_EDX * 8))[uVar6];
    uVar10 = uVar1 & ~(1 << (uVar5 & 0x1f));
    if (iVar9 != 0) {
      uVar10 = uVar1 | 1 << (uVar5 & 0x1f);
    }
    (*(mod2word **)((long)__stream->_IO_read_end + (ulong)extraout_EDX * 8))[uVar6] = uVar10;
    return;
  }
  mod2dense_set_cold_1();
  if (((-1 < (int)m_00) && (-1 < extraout_EDX_00)) &&
     (((int)m_00 < __stream->_flags && (extraout_EDX_00 < *(int *)&__stream->field_0x4)))) {
    return;
  }
  mod2dense_get_cold_1();
  if (m_00->_flags < __stream->_flags) {
LAB_0012329b:
    mod2dense_copycols_cold_2();
    if (0 < m_00->_flags) {
      iVar9 = 0;
      do {
        if (0 < *(int *)&m_00->field_0x4) {
          iVar11 = 0;
          do {
            uVar5 = mod2dense_get((mod2dense *)m_00,iVar9,iVar11);
            fprintf(__stream," %d",(ulong)uVar5);
            iVar11 = iVar11 + 1;
          } while (iVar11 < *(int *)&m_00->field_0x4);
        }
        fputc(10,__stream);
        iVar9 = iVar9 + 1;
      } while (iVar9 < m_00->_flags);
    }
    return;
  }
  if (0 < *(int *)&m_00->field_0x4) {
    lVar8 = 0;
    do {
      iVar9 = *(int *)(extraout_RDX_00 + lVar8 * 4);
      if ((iVar9 < 0) || (*(int *)&__stream->field_0x4 <= iVar9)) {
        mod2dense_copycols_cold_1();
        goto LAB_0012329b;
      }
      if (*(int *)&__stream->_IO_read_ptr < 1) {
        uVar6 = 0;
      }
      else {
        ppmVar4 = (mod2word **)__stream->_IO_read_end;
        pmVar2 = *(mod2word **)((long)m_00->_IO_read_end + lVar8 * 8);
        uVar6 = 0;
        do {
          pmVar2[uVar6] = ppmVar4[*(int *)(extraout_RDX_00 + lVar8 * 4)][uVar6];
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)*(int *)&__stream->_IO_read_ptr);
      }
      if ((int)uVar6 < *(int *)&m_00->_IO_read_ptr) {
        pmVar2 = *(mod2word **)((long)m_00->_IO_read_end + lVar8 * 8);
        uVar6 = uVar6 & 0xffffffff;
        do {
          pmVar2[uVar6] = 0;
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < *(int *)&m_00->_IO_read_ptr);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)&m_00->field_0x4);
  }
  return;
}

Assistant:

void mod2dense_copy
( mod2dense *m,		/* Matrix to copy */
  mod2dense *r		/* Place to store copy of matrix */
)
{ 
  int k, j;

  if (mod2dense_rows(m)>mod2dense_rows(r) 
   || mod2dense_cols(m)>mod2dense_cols(r))
  { fprintf(stderr,"mod2dense_copy: Destination matrix is too small\n");
    exit(1);
  }

  for (j = 0; j<mod2dense_cols(m); j++)
  { for (k = 0; k<m->n_words; k++)
    { r->col[j][k] = m->col[j][k];
    }
    for ( ; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }

  for ( ; j<mod2dense_cols(r); j++)
  { for (k = 0; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }
}